

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O0

int __thiscall
BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::HaveK
          (BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *C,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k)

{
  reference pvVar1;
  reference __lhs;
  bool local_49;
  int local_2c;
  int i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k_local;
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *C_local;
  BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  local_2c = 0;
  while( true ) {
    local_49 = false;
    if (local_2c < this->N + -1) {
      pvVar1 = std::vector<char,_std::allocator<char>_>::operator[](&C->v,(long)local_2c);
      local_49 = false;
      if (*pvVar1 == '1') {
        __lhs = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[](&C->k,(long)local_2c);
        local_49 = std::operator!=(__lhs,k);
      }
    }
    if (local_49 == false) break;
    local_2c = local_2c + 1;
  }
  if ((local_2c != this->N + -1) &&
     (pvVar1 = std::vector<char,_std::allocator<char>_>::operator[](&C->v,(long)local_2c),
     *pvVar1 != '0')) {
    return 1;
  }
  return 0;
}

Assistant:

int BpTree<K>::HaveK(IndexNode<K> C, K k) {
	int i;
	for (i = 0; i < N - 1 && C.v[i] == '1' && C.k[i] != k; i++);
	if (i == N - 1 || C.v[i] == '0')		return 0;
	else									return 1;
}